

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int p_count(parse *p)

{
  char *pcVar1;
  bool bVar2;
  ushort **ppuVar3;
  int local_18;
  int local_14;
  int ndigits;
  int count;
  parse *p_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    bVar2 = false;
    if (p->next < p->end) {
      ppuVar3 = __ctype_b_loc();
      bVar2 = false;
      if (((*ppuVar3)[(int)*p->next] & 0x800) != 0) {
        bVar2 = local_14 < 0x100;
      }
    }
    if (!bVar2) break;
    pcVar1 = p->next;
    p->next = pcVar1 + 1;
    local_14 = local_14 * 10 + *pcVar1 + -0x30;
    local_18 = local_18 + 1;
  }
  if ((local_18 < 1) || (0xff < local_14)) {
    seterr(p,10);
  }
  return local_14;
}

Assistant:

static int			/* the value */
p_count(p)
struct parse *p;
{
	int count = 0;
	int ndigits = 0;

	while (MORE() && isdigit(PEEK()) && count <= DUPMAX) {
		count = count*10 + (GETNEXT() - '0');
		ndigits++;
	}

	REQUIRE(ndigits > 0 && count <= DUPMAX, REG_BADBR);
	return(count);
}